

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall ImVector<ImFontConfig>::push_back(ImVector<ImFontConfig> *this,ImFontConfig *v)

{
  float *pfVar1;
  ImFontConfig *pIVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ImWchar *pIVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ImFontConfig *pIVar14;
  float fVar15;
  bool bVar16;
  undefined3 uVar17;
  float fVar18;
  int iVar19;
  int iVar20;
  bool bVar21;
  undefined3 uVar22;
  float fVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  
  iVar25 = this->Size;
  if (iVar25 == this->Capacity) {
    if (iVar25 == 0) {
      iVar24 = 8;
    }
    else {
      iVar24 = iVar25 / 2 + iVar25;
    }
    iVar26 = iVar25 + 1;
    if (iVar25 + 1 < iVar24) {
      iVar26 = iVar24;
    }
    reserve(this,iVar26);
    iVar25 = this->Size;
  }
  pIVar2 = this->Data;
  pIVar2[iVar25].DstFont = v->DstFont;
  pvVar3 = v->FontData;
  iVar24 = v->FontDataSize;
  bVar16 = v->FontDataOwnedByAtlas;
  uVar17 = *(undefined3 *)&v->field_0xd;
  iVar26 = v->FontNo;
  fVar18 = v->SizePixels;
  iVar19 = v->OversampleH;
  iVar20 = v->OversampleV;
  bVar21 = v->PixelSnapH;
  uVar22 = *(undefined3 *)&v->field_0x21;
  fVar23 = (v->GlyphExtraSpacing).x;
  uVar4 = *(undefined8 *)&(v->GlyphExtraSpacing).y;
  uVar5 = *(undefined8 *)&(v->GlyphOffset).y;
  pIVar6 = v->GlyphRanges;
  fVar15 = v->GlyphMaxAdvanceX;
  uVar7 = *(undefined8 *)&v->MergeMode;
  uVar8 = *(undefined8 *)&v->RasterizerMultiply;
  uVar9 = *(undefined8 *)(v->Name + 2);
  uVar10 = *(undefined8 *)(v->Name + 10);
  uVar11 = *(undefined8 *)(v->Name + 0x12);
  uVar12 = *(undefined8 *)(v->Name + 0x1a);
  uVar13 = *(undefined8 *)(v->Name + 0x22);
  pIVar14 = pIVar2 + iVar25;
  pfVar1 = &pIVar14->GlyphMinAdvanceX;
  pIVar14->GlyphMinAdvanceX = v->GlyphMinAdvanceX;
  pIVar14->GlyphMaxAdvanceX = fVar15;
  *(undefined8 *)(pfVar1 + 2) = uVar7;
  *(undefined8 *)(pfVar1 + 4) = uVar8;
  *(undefined8 *)(pfVar1 + 6) = uVar9;
  *(undefined8 *)(pfVar1 + 8) = uVar10;
  *(undefined8 *)(pfVar1 + 10) = uVar11;
  *(undefined8 *)(pfVar1 + 0xc) = uVar12;
  *(undefined8 *)(pfVar1 + 0xe) = uVar13;
  pIVar2 = pIVar2 + iVar25;
  pIVar2->FontData = pvVar3;
  pIVar2->FontDataSize = iVar24;
  pIVar2->FontDataOwnedByAtlas = bVar16;
  *(undefined3 *)&pIVar2->field_0xd = uVar17;
  pIVar2->FontNo = iVar26;
  pIVar2->SizePixels = fVar18;
  pIVar2->OversampleH = iVar19;
  pIVar2->OversampleV = iVar20;
  pIVar2->PixelSnapH = bVar21;
  *(undefined3 *)&pIVar2->field_0x21 = uVar22;
  (pIVar2->GlyphExtraSpacing).x = fVar23;
  *(undefined8 *)&(pIVar2->GlyphExtraSpacing).y = uVar4;
  *(undefined8 *)&(pIVar2->GlyphOffset).y = uVar5;
  pIVar2->GlyphRanges = pIVar6;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }